

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

tuple<int,_int,_int> __thiscall
anon_unknown.dwarf_eaf21::preprocessor<baryonyx::problem>::reduce
          (preprocessor<baryonyx::problem> *this,constraint *constraint)

{
  long lVar1;
  long lVar2;
  iterator iVar3;
  long in_RDX;
  long lVar4;
  long extraout_RDX;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  tuple<int,_int,_int> tVar9;
  uint local_3c;
  
  lVar1 = *(long *)(in_RDX + 0x18);
  iVar6 = *(int *)(in_RDX + 0x28);
  lVar2 = *(long *)(in_RDX + 0x10);
  local_3c = 0xffffffff;
  lVar7 = 4;
  uVar5 = 0;
  lVar4 = in_RDX;
  do {
    if (((ulong)(lVar1 - lVar2) >> 3 & 0xffffffff) == uVar5) {
      if ((int)local_3c < 0) {
        auVar8 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      }
      else {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(*(long *)(in_RDX + 0x10) + (ulong)local_3c * 8);
      }
      auVar8 = vpshufd_avx(auVar8,0xe1);
      *(int *)&this->ctx = iVar6;
      *(long *)((long)&this->ctx + 4) = auVar8._0_8_;
      tVar9.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
           (int)lVar4;
      tVar9.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
           (_Tuple_impl<1UL,_int,_int>)this;
      return (tuple<int,_int,_int>)tVar9.super__Tuple_impl<0UL,_int,_int,_int>;
    }
    iVar3 = std::
            _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&constraint->elements,(key_type *)(*(long *)(in_RDX + 0x10) + lVar7));
    if (iVar3.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
        (__node_type *)0x0) {
      if (local_3c != 0xffffffff) {
        baryonyx::details::fail_fast
                  ("Assertion","remaining_index == -1",
                   "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                   ,"171");
      }
      local_3c = (uint)uVar5;
    }
    else {
      iVar6 = iVar6 - (uint)*(byte *)((long)iVar3.
                                            super__Node_iterator_base<std::pair<const_int,_bool>,_false>
                                            ._M_cur + 0xc) *
                      *(int *)(*(long *)(in_RDX + 0x10) + uVar5 * 8);
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 8;
    lVar4 = extraout_RDX;
  } while( true );
}

Assistant:

auto reduce(const bx::constraint& constraint) -> std::tuple<int, int, int>
    {
        int constraint_result{ constraint.value };
        int remaining_index{ -1 };
        int factor;
        int var_id;

        for (int i = 0, e = bx::length(constraint.elements); i != e; ++i) {

            // Searches if the variable is already affected and then use the
            // value to update the value of the constraint.

            auto it = vars.find(constraint.elements[i].variable_index);
            if (it == vars.end()) {
                bx_assert(remaining_index == -1);
                remaining_index = i;
            } else {
                constraint_result +=
                  -1 * (constraint.elements[i].factor * it->second);
            }
        }

        if (remaining_index >= 0) {
            factor = constraint.elements[remaining_index].factor;
            var_id = constraint.elements[remaining_index].variable_index;
        } else {
            factor = -1;
            var_id = -1;
        }

        return std::make_tuple(factor, var_id, constraint_result);
    }